

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

WindowQuantileState<duckdb::timestamp_t> * __thiscall
duckdb::QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState
          (QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> *this)

{
  bool bVar1;
  type pWVar2;
  unique_ptr<duckdb::WindowQuantileState<duckdb::timestamp_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::timestamp_t>_>,_true>
  *in_RDI;
  unique_ptr<duckdb::WindowQuantileState<duckdb::timestamp_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::timestamp_t>_>,_true>
  *in_stack_fffffffffffffff0;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowQuantileState<duckdb::timestamp_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::timestamp_t>_>_>
                      *)0x1d7afbb);
  if (!bVar1) {
    make_uniq<duckdb::WindowQuantileState<duckdb::timestamp_t>>();
    unique_ptr<duckdb::WindowQuantileState<duckdb::timestamp_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::timestamp_t>_>,_true>
    ::operator=(in_stack_fffffffffffffff0,in_RDI);
    unique_ptr<duckdb::WindowQuantileState<duckdb::timestamp_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::timestamp_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::WindowQuantileState<duckdb::timestamp_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::timestamp_t>_>,_true>
                   *)0x1d7afe5);
  }
  pWVar2 = unique_ptr<duckdb::WindowQuantileState<duckdb::timestamp_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::timestamp_t>_>,_true>
           ::operator*(in_stack_fffffffffffffff0);
  return pWVar2;
}

Assistant:

WindowQuantileState<INPUT_TYPE> &GetOrCreateWindowState() {
		if (!window_state) {
			window_state = make_uniq<WindowQuantileState<INPUT_TYPE>>();
		}
		return *window_state;
	}